

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.h
# Opt level: O3

void __thiscall mjs::global_object::global_object(global_object *this,global_object *param_2)

{
  bool *pbVar1;
  undefined8 uVar2;
  gc_heap_ptr_untracked<mjs::gc_string,_true> gVar3;
  gc_heap_ptr_untracked<mjs::object,_true> gVar4;
  undefined4 uVar5;
  
  (this->super_object)._vptr_object = (_func_int **)&PTR_get_001d5910;
  gVar3.pos_ = (param_2->super_object).class_.pos_;
  gVar4.pos_ = (param_2->super_object).prototype_.pos_;
  (this->super_object).heap_ = (param_2->super_object).heap_;
  (this->super_object).class_ = (gc_heap_ptr_untracked<mjs::gc_string,_true>)gVar3.pos_;
  (this->super_object).prototype_ = (gc_heap_ptr_untracked<mjs::object,_true>)gVar4.pos_;
  *(undefined8 *)((long)&(this->super_object).prototype_.pos_ + 1) =
       *(undefined8 *)((long)&(param_2->super_object).prototype_.pos_ + 1);
  (this->super_object)._vptr_object = (_func_int **)&PTR_get_001d5490;
  uVar5 = *(undefined4 *)&param_2->field_0x24;
  pbVar1 = param_2->strict_mode_;
  this->version_ = param_2->version_;
  *(undefined4 *)&this->field_0x24 = uVar5;
  this->strict_mode_ = pbVar1;
  *(undefined8 *)&(this->stack_trace_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->stack_trace_).super__Function_base._M_functor + 8) = 0;
  (this->stack_trace_).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->stack_trace_)._M_invoker = (param_2->stack_trace_)._M_invoker;
  if ((param_2->stack_trace_).super__Function_base._M_manager != (_Manager_type)0x0) {
    uVar2 = *(undefined8 *)((long)&(param_2->stack_trace_).super__Function_base._M_functor + 8);
    *(undefined8 *)&(this->stack_trace_).super__Function_base._M_functor =
         *(undefined8 *)&(param_2->stack_trace_).super__Function_base._M_functor;
    *(undefined8 *)((long)&(this->stack_trace_).super__Function_base._M_functor + 8) = uVar2;
    (this->stack_trace_).super__Function_base._M_manager =
         (param_2->stack_trace_).super__Function_base._M_manager;
    (param_2->stack_trace_).super__Function_base._M_manager = (_Manager_type)0x0;
    (param_2->stack_trace_)._M_invoker = (_Invoker_type)0x0;
  }
  *(undefined8 *)&(this->strict_mode_func_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->strict_mode_func_).super__Function_base._M_functor + 8) = 0;
  (this->strict_mode_func_).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->strict_mode_func_)._M_invoker = (param_2->strict_mode_func_)._M_invoker;
  if ((param_2->strict_mode_func_).super__Function_base._M_manager != (_Manager_type)0x0) {
    uVar2 = *(undefined8 *)((long)&(param_2->strict_mode_func_).super__Function_base._M_functor + 8)
    ;
    *(undefined8 *)&(this->strict_mode_func_).super__Function_base._M_functor =
         *(undefined8 *)&(param_2->strict_mode_func_).super__Function_base._M_functor;
    *(undefined8 *)((long)&(this->strict_mode_func_).super__Function_base._M_functor + 8) = uVar2;
    (this->strict_mode_func_).super__Function_base._M_manager =
         (param_2->strict_mode_func_).super__Function_base._M_manager;
    (param_2->strict_mode_func_).super__Function_base._M_manager = (_Manager_type)0x0;
    (param_2->strict_mode_func_)._M_invoker = (_Invoker_type)0x0;
  }
  return;
}

Assistant:

object(object&& o) = default;